

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O2

void ContinuousReadTest(BasePort *port,uchar boardNum)

{
  int iVar1;
  ulong uVar2;
  ostream *poVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  quadlet_t read_data;
  long local_50;
  long local_48;
  uint local_3c;
  long local_38;
  
  uVar4 = 1;
  local_38 = 0;
  local_3c = (uint)boardNum;
  local_48 = 0;
  lVar5 = 0;
  local_50 = 0;
  uVar6 = 0;
  for (bVar7 = false; !bVar7; bVar7 = bVar7 || 5 < uVar2) {
    read_data = 0;
    iVar1 = (*port->_vptr_BasePort[0x23])(port,(ulong)local_3c,4,&read_data);
    if ((char)iVar1 == '\0') {
      lVar5 = lVar5 + 1;
    }
    else if (read_data == 0x514c4131) {
      local_48 = local_48 + 1;
    }
    else {
      local_50 = local_50 + 1;
    }
    uVar2 = local_50 + lVar5;
    bVar7 = 9999 < uVar4;
    if ((uVar4 / 1000) * -1000 + 1 + uVar4 == 1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Success = ");
      *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,", read failures = ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,", compare failures = ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    local_38 = local_38 + -1;
    uVar4 = uVar4 + 1;
    uVar6 = uVar6 + 1;
  }
  local_38 = local_38 + (uVar6 / 1000) * 1000;
  if (local_38 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Success = ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", read failures = ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", compare failures = ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return;
}

Assistant:

void  ContinuousReadTest(BasePort *port, unsigned char boardNum)
{
    bool done = false;
    quadlet_t read_data;
    //char buf[5] = "QLA1";
    char buf[5] = "1ALQ";
    size_t success = 0;
    size_t readFailures = 0;
    size_t compareFailures = 0;
    unsigned long count = 0;
    while (!done) {
        count++;
        read_data = 0;
        if (!port->ReadQuadlet(boardNum, 4, read_data))
            readFailures++;
        else {
            if (memcmp((void *)&read_data, buf, 4) == 0)
                success++;
            else
                compareFailures++;
        }
        if (readFailures + compareFailures > 5) done = true;
        if (count >= 10000) done = true;

        // print status
        if (count % 1000 == 0) {
            std::cout << "Success = " << std::dec << success << ", read failures = " << readFailures << ", compare failures = "
                      << compareFailures << std::endl;
        }
    }
    if (count % 1000 != 0) {
        std::cout << "Success = " << std::dec << success << ", read failures = " << readFailures << ", compare failures = "
                  << compareFailures << std::endl;
    }
}